

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_stdcxx.h
# Opt level: O0

bool leveldb::port::Snappy_Uncompress(char *input,size_t length,char *output)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

inline bool Snappy_Uncompress(const char* input, size_t length, char* output) {
#if HAVE_SNAPPY
  return snappy::RawUncompress(input, length, output);
#else
  // Silence compiler warnings about unused arguments.
  (void)input;
  (void)length;
  (void)output;
  return false;
#endif  // HAVE_SNAPPY
}